

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
GetGenericProperty<std::__cxx11::string>
          (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *list,char *szName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *errorReturn)

{
  const_iterator cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint32_t hash;
  
  if (szName != (char *)0x0) {
    SuperFastHash(szName,0,0);
    cVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&list->_M_t,&hash);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &cVar1._M_node[1]._M_parent;
    if ((_Rb_tree_header *)cVar1._M_node == &(list->_M_t)._M_impl.super__Rb_tree_header) {
      pbVar2 = errorReturn;
    }
    return pbVar2;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                ,0x4b,
                "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = std::basic_string<char>]"
               );
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}